

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# return.c
# Opt level: O1

void OP_contextsw(void)

{
  contextsw((DLword)MachineState.tosvalue,1,2);
  return;
}

Assistant:

void OP_contextsw(void) {
#ifdef TRACE
  printf("OP_contextsw:\n");
#endif

  contextsw(TopOfStack & 0xffff, 1, 2);
  /* TOS will be smashed ?? I'm not sure .
        PC will be incremented 1. */

}